

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int alloc_addbyter(uchar outc,void *f)

{
  undefined1 uVar1;
  CURLcode CVar2;
  CURLcode result;
  asprintf *infop;
  void *f_local;
  uchar outc_local;
  
  f_local._3_1_ = outc;
  CVar2 = Curl_dyn_addn(*f,(void *)((long)&f_local + 3),1);
  if (CVar2 == CURLE_OK) {
    f_local._4_4_ = 0;
  }
  else {
    uVar1 = 1;
    if (CVar2 == CURLE_TOO_LARGE) {
      uVar1 = 2;
    }
    *(undefined1 *)((long)f + 8) = uVar1;
    f_local._4_4_ = 1;
  }
  return f_local._4_4_;
}

Assistant:

static int alloc_addbyter(unsigned char outc, void *f)
{
  struct asprintf *infop = f;
  CURLcode result = Curl_dyn_addn(infop->b, &outc, 1);
  if(result) {
    infop->merr = result == CURLE_TOO_LARGE ? MERR_TOO_LARGE : MERR_MEM;
    return 1 ; /* fail */
  }
  return 0;
}